

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chizu.c
# Opt level: O1

czrect chizu_internal_lease_or_enlarge(chizu *atlas,uint width,uint height,void *data)

{
  uint uVar1;
  czmap *dst;
  uint uVar2;
  uint uVar3;
  czrect cVar4;
  
  while( true ) {
    cVar4 = czmap_lease(atlas->map,width,height,data);
    if (cVar4._0_8_ != 0 || cVar4._8_8_ != 0) break;
    uVar2 = height;
    if (height < width) {
      uVar2 = width;
    }
    uVar3 = (atlas->size).w;
    uVar1 = (atlas->size).h;
    if (uVar1 < uVar3) {
      (atlas->size).h = uVar1 + uVar2;
    }
    else {
      (atlas->size).w = uVar3 + uVar2;
    }
    uVar2 = (atlas->size).w - 1;
    uVar2 = uVar2 >> 1 | uVar2;
    uVar2 = uVar2 >> 2 | uVar2;
    uVar2 = uVar2 >> 4 | uVar2;
    uVar2 = uVar2 >> 8 | uVar2;
    uVar3 = (uVar2 >> 0x10 | uVar2) + 1;
    (atlas->size).w = uVar3;
    uVar2 = (atlas->size).h - 1;
    uVar2 = uVar2 >> 1 | uVar2;
    uVar2 = uVar2 >> 2 | uVar2;
    uVar2 = uVar2 >> 4 | uVar2;
    uVar2 = uVar2 >> 8 | uVar2;
    uVar2 = (uVar2 >> 0x10 | uVar2) + 1;
    (atlas->size).h = uVar2;
    dst = czmap_create(uVar3,uVar2);
    czmap_copy(atlas->map,dst);
    czmap_destroy(atlas->map,(czdestroyfunc)0x0);
    atlas->map = dst;
  }
  return cVar4;
}

Assistant:

static czrect chizu_internal_lease_or_enlarge(chizu * atlas, unsigned width, unsigned height, void * data) {
    czrect resultrect;
    unsigned inc = 0;
    czmap * newmap = NULL;
    resultrect = czmap_lease(atlas->map, width, height, data);
    if (!czrect_is_empty(resultrect))
        return resultrect;

    /* find the largest size to expand map with */
    inc = width;
    if (width < height) inc = height;

    if (atlas->size.w > atlas->size.h)
        atlas->size.h += inc;
    else
        atlas->size.w += inc;

    atlas->size.w = chizu_internal_next_power_of_2(atlas->size.w);
    atlas->size.h = chizu_internal_next_power_of_2(atlas->size.h);

    /* create a new map and copy contents */
    newmap = czmap_create(atlas->size.w, atlas->size.h);
    czmap_copy(atlas->map, newmap);
    czmap_destroy(atlas->map, NULL);
    atlas->map = newmap;

    /* try again until space was found */
    return chizu_internal_lease_or_enlarge(atlas, width, height, data);
}